

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpeg.c
# Opt level: O2

sei_message_t * sei_message_new(sei_msgtype_t type,uint8_t *data,size_t size)

{
  sei_message_t *psVar1;
  
  psVar1 = (sei_message_t *)malloc(size + 0x18);
  psVar1->next = (_sei_message_t *)0x0;
  psVar1->type = type;
  psVar1->size = size;
  if (data == (uint8_t *)0x0) {
    memset(psVar1 + 1,0,size);
  }
  else {
    memcpy(psVar1 + 1,data,size);
  }
  return psVar1;
}

Assistant:

sei_message_t* sei_message_new(sei_msgtype_t type, uint8_t* data, size_t size)
{
    struct _sei_message_t* msg = (struct _sei_message_t*)malloc(sizeof(struct _sei_message_t) + size);
    msg->next = 0;
    msg->type = type;
    msg->size = size;

    if (data) {
        memcpy(sei_message_data(msg), data, size);
    } else {
        memset(sei_message_data(msg), 0, size);
    }

    return (sei_message_t*)msg;
}